

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_15::BinaryReaderIR::PushLabel
          (BinaryReaderIR *this,LabelType label_type,ExprList *first,Expr *context)

{
  pointer pLVar1;
  pointer this_00;
  pointer pLVar2;
  ExprList *pEVar3;
  undefined4 uVar4;
  ulong uVar5;
  ulong uVar6;
  pointer pLVar7;
  pointer pLVar8;
  long lVar9;
  ulong uVar10;
  
  pLVar1 = (this->label_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pLVar1 == (this->label_stack_).
                super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    this_00 = (this->label_stack_).
              super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((long)pLVar1 - (long)this_00 == 0x7ffffffffffffff8) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar5 = ((long)pLVar1 - (long)this_00) / 0x18;
    uVar6 = 1;
    if (pLVar1 != this_00) {
      uVar6 = uVar5;
    }
    uVar10 = uVar6 + uVar5;
    if (0x555555555555554 < uVar10) {
      uVar10 = 0x555555555555555;
    }
    if (CARRY8(uVar6,uVar5)) {
      uVar10 = 0x555555555555555;
    }
    if (uVar10 == 0) {
      pLVar7 = (pointer)0x0;
    }
    else {
      pLVar7 = (pointer)operator_new(uVar10 * 0x18);
    }
    pLVar7[uVar5].label_type = label_type;
    pLVar7[uVar5].exprs = first;
    pLVar7[uVar5].context = context;
    pLVar2 = pLVar7;
    for (pLVar8 = this_00; pLVar8 != pLVar1; pLVar8 = pLVar8 + 1) {
      pLVar2->context = pLVar8->context;
      uVar4 = *(undefined4 *)&pLVar8->field_0x4;
      pEVar3 = pLVar8->exprs;
      pLVar2->label_type = pLVar8->label_type;
      *(undefined4 *)&pLVar2->field_0x4 = uVar4;
      pLVar2->exprs = pEVar3;
      pLVar2 = pLVar2 + 1;
    }
    lVar9 = (long)(this->label_stack_).
                  super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)this_00;
    std::
    _Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
    ::_M_deallocate((_Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
                     *)this_00,(pointer)(lVar9 / 0x18),lVar9 % 0x18);
    (this->label_stack_).
    super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
    ._M_impl.super__Vector_impl_data._M_start = pLVar7;
    (this->label_stack_).
    super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
    ._M_impl.super__Vector_impl_data._M_finish = pLVar2 + 1;
    (this->label_stack_).
    super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pLVar7 + uVar10;
  }
  else {
    *(LabelType *)&(((_Vector_impl *)&pLVar1->label_type)->super__Vector_impl_data)._M_start =
         label_type;
    pLVar1->exprs = first;
    pLVar1->context = context;
    (this->label_stack_).
    super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
    ._M_impl.super__Vector_impl_data._M_finish = pLVar1 + 1;
  }
  return;
}

Assistant:

void BinaryReaderIR::PushLabel(LabelType label_type,
                               ExprList* first,
                               Expr* context) {
  label_stack_.emplace_back(label_type, first, context);
}